

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O0

void __thiscall
bwtil::HuffmanTree<unsigned_char>::storeTree
          (HuffmanTree<unsigned_char> *this,Node n,
          vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
          *nodes_vec)

{
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  *in_stack_000000a0;
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  *in_stack_ffffffffffffff60;
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  *in_stack_ffffffffffffff98;
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  *in_stack_ffffffffffffffa0;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x14f4df);
  std::
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  storeTree(this,(vector<bool,_std::allocator<bool>_> *)nodes_vec,n,in_stack_000000a0);
  std::
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::~vector(in_stack_ffffffffffffff60);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x14f54e)
  ;
  return;
}

Assistant:

void storeTree(Node n,vector<Node> nodes_vec){

			//root_node = n.node_number;
			storeTree(vector<bool>(),n,nodes_vec);

		}